

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_ApproximateSizes_Test::TestBody(DBTest_ApproximateSizes_Test *this)

{
  ulong *puVar1;
  DB *pDVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  int i;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int i_00;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int i_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var11;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_07;
  long *extraout_RDX_08;
  long extraout_RDX_09;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_13;
  long extraout_RDX_14;
  uint uVar14;
  long *plVar15;
  pointer *__ptr;
  long *plVar16;
  char *pcVar17;
  char *in_R9;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  AssertionResult AVar21;
  string cstart_str;
  string r;
  Slice cend;
  uint64_t size;
  uint64_t size_3;
  Random rnd;
  Options options;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  undefined1 local_101;
  Slice local_100;
  string local_f0;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_d0;
  undefined7 uStack_cf;
  undefined8 *local_c8;
  int local_c0;
  Random local_bc;
  ulong local_b8;
  void *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined8 *puStack_a0;
  Options local_90;
  
  do {
    paVar12 = &local_128.field_2;
    DBTest::CurrentOptions(&local_90,&this->super_DBTest);
    local_90.write_buffer_size = 100000000;
    local_90.compression = kNoCompression;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
    local_148._0_8_ = "";
    local_148._8_8_ = (undefined8 *)0x0;
    local_138._M_allocated_capacity = 0x17bad5;
    local_138._8_8_ = (undefined8 *)0x3;
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_f0._M_dataplus._M_p,0,0);
      local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffffff00;
      local_128._M_string_length = 0;
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)&local_128,
                 (AssertionResult *)"Between(Size(\"\", \"xyz\"), 0, 0)","false","true",in_R9);
      iVar6 = 0x49e;
LAB_00120aae:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,iVar6,(char *)local_148._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      puVar10 = (undefined8 *)local_128._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
        puVar10 = (undefined8 *)local_128._M_string_length;
      }
LAB_001207dd:
      if (puVar10 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar10 != puVar10 + 2) {
          operator_delete((undefined8 *)*puVar10);
        }
        operator_delete(puVar10);
      }
      return;
    }
    DBTest::Reopen(&this->super_DBTest,&local_90);
    local_148._0_8_ = "";
    local_148._8_8_ = (undefined8 *)0x0;
    local_138._M_allocated_capacity = 0x17bad5;
    local_138._8_8_ = (undefined8 *)0x3;
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_f0._M_dataplus._M_p,0,0);
      local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffffff00;
      local_128._M_string_length = 0;
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)&local_128,
                 (AssertionResult *)"Between(Size(\"\", \"xyz\"), 0, 0)","false","true",in_R9);
      iVar6 = 0x4a0;
      goto LAB_00120aae;
    }
    iVar6 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
    local_128._M_dataplus._M_p._0_4_ = iVar6;
    local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
    AVar21 = testing::internal::CmpHelperEQ<int,int>
                       ((internal *)local_148,"NumTableFilesAtLevel(0)","0",(int *)&local_128,
                        (int *)&local_f0);
    uVar3 = local_148._8_8_;
    _Var11._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar21.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_148[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_128);
      pcVar17 = "";
      if ((undefined8 *)local_148._8_8_ != (undefined8 *)0x0) {
        pcVar17 = *(char **)local_148._8_8_;
      }
      iVar6 = 0x4a3;
LAB_00120844:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,iVar6,pcVar17);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      puVar10 = (undefined8 *)local_148._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
        puVar10 = (undefined8 *)local_148._8_8_;
      }
      goto LAB_001207dd;
    }
    if ((undefined8 *)local_148._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._8_8_ != (undefined8 *)(local_148._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_148._8_8_);
      }
      operator_delete((void *)uVar3);
      _Var11 = extraout_RDX.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    }
    local_bc.seed_ = 0x12d;
    uVar14 = 0;
    do {
      Key_abi_cxx11_((string *)local_148,(leveldb *)(ulong)uVar14,(int)_Var11._M_head_impl);
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity =
           local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_128._M_dataplus._M_p = (pointer)paVar12;
      test::RandomString(&local_bc,100000,&local_128);
      pDVar2 = (this->super_DBTest).db_;
      local_101 = 0;
      local_f0._M_dataplus._M_p = (pointer)local_148._0_8_;
      local_f0._M_string_length = local_148._8_8_;
      local_100.data_ = local_128._M_dataplus._M_p;
      local_100.size_ = local_128._M_string_length;
      (*pDVar2->_vptr_DB[2])(&local_b0,pDVar2,&local_101,&local_f0);
      AVar21 = testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
               operator()(&local_d0,(char *)&local_f0,
                          (Status *)"Put(Key(i), RandomString(&rnd, S1))");
      _Var11._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar21.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_b0 != (void *)0x0) {
        operator_delete__(local_b0);
        _Var11._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_00._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar12) {
        operator_delete(local_128._M_dataplus._M_p);
        _Var11._M_head_impl = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
        _Var11._M_head_impl = extraout_RDX_02._M_head_impl;
      }
      puVar10 = local_c8;
      if (local_d0 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)local_148);
        if (local_c8 == (undefined8 *)0x0) {
          pcVar17 = "";
        }
        else {
          pcVar17 = (char *)*local_c8;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x4a9,pcVar17);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
        puVar10 = local_c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_148._0_8_ + 8))();
          puVar10 = local_c8;
        }
        goto LAB_001207dd;
      }
      if (local_c8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_c8 != local_c8 + 2) {
          operator_delete((undefined8 *)*local_c8);
        }
        operator_delete(puVar10);
        _Var11._M_head_impl = extraout_RDX_03;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x50);
    Key_abi_cxx11_(&local_128,(leveldb *)0x32,(int)_Var11._M_head_impl);
    local_148._0_8_ = "";
    local_148._8_8_ = (undefined8 *)0x0;
    local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
    local_138._8_8_ = local_128._M_string_length;
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_100);
    pcVar17 = local_100.data_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.data_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100.data_,0,0);
    }
    local_f0._M_dataplus._M_p._0_1_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar17 ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_f0._M_string_length = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar12) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar17 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)&local_f0,
                 (AssertionResult *)"Between(Size(\"\", Key(50)), 0, 0)","false","true",in_R9);
      iVar6 = 0x4ad;
LAB_001206bc:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,iVar6,(char *)local_148._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
LAB_001206e1:
        operator_delete((void *)local_148._0_8_);
      }
LAB_001206e6:
      puVar10 = (undefined8 *)local_f0._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
        puVar10 = (undefined8 *)local_f0._M_string_length;
      }
      goto LAB_001207dd;
    }
    if ((local_90.reuse_logs & 1U) == 0) {
      iVar6 = 0;
      do {
        local_c0 = iVar6;
        DBTest::Reopen(&this->super_DBTest,&local_90);
        uVar8 = 0;
        lVar13 = extraout_RDX_04;
        do {
          plVar15 = (long *)0x0;
          plVar16 = (long *)0x0;
          uVar18 = 0;
          local_b8 = uVar8;
          do {
            Key_abi_cxx11_(&local_128,(leveldb *)(uVar18 & 0xffffffff),(int)lVar13);
            local_148._0_8_ = "";
            local_148._8_8_ = (undefined8 *)0x0;
            local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
            local_138._8_8_ = local_128._M_string_length;
            pDVar2 = (this->super_DBTest).db_;
            (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_100);
            bVar19 = plVar15 <= local_100.data_;
            bVar20 = local_100.data_ <= plVar16;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100.data_;
            if (!bVar20 || !bVar19) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100.data_,plVar15,
                      plVar16);
              paVar12 = extraout_RDX_07;
            }
            iVar6 = (int)paVar12;
            local_f0._M_dataplus._M_p._0_1_ = bVar20 && bVar19;
            local_f0._M_string_length = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
              iVar6 = extraout_EDX;
            }
            if (!bVar20 || !bVar19) {
              testing::Message::Message((Message *)&local_128);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_148,(internal *)&local_f0,
                         (AssertionResult *)"Between(Size(\"\", Key(i)), S1 * i, S2 * i)","false",
                         "true",in_R9);
              iVar6 = 0x4bd;
              goto LAB_001206bc;
            }
            Key_abi_cxx11_(&local_f0,(leveldb *)(uVar18 & 0xffffffff),iVar6);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            puVar1 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar1) {
              local_128.field_2._M_allocated_capacity = *puVar1;
              local_128.field_2._8_4_ = (undefined4)plVar9[3];
              local_128.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            }
            else {
              local_128.field_2._M_allocated_capacity = *puVar1;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_138._8_8_ = plVar9[1];
            *plVar9 = (long)puVar1;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            local_148._0_8_ = "";
            local_148._8_8_ = (undefined8 *)0x0;
            local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
            pDVar2 = (this->super_DBTest).db_;
            local_128._M_string_length = local_138._8_8_;
            (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_d0);
            plVar9 = (long *)CONCAT71(uStack_cf,local_d0);
            bVar19 = plVar15 + 0x30d4 <= plVar9;
            bVar20 = plVar9 <= plVar16 + 0x3345;
            if (!bVar20 || !bVar19) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n");
              plVar9 = extraout_RDX_08;
            }
            iVar6 = (int)plVar9;
            local_100.data_ = (char *)CONCAT71(local_100.data_._1_7_,bVar20 && bVar19);
            local_100.size_ = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
              iVar6 = extraout_EDX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
              iVar6 = extraout_EDX_01;
            }
            if (!bVar20 || !bVar19) {
              testing::Message::Message((Message *)&local_128);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_148,(internal *)&local_100,
                         (AssertionResult *)
                         "Between(Size(\"\", Key(i) + \".suffix\"), S1 * (i + 1), S2 * (i + 1))",
                         "false","true",in_R9);
              iVar6 = 0x4bf;
LAB_0012079e:
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,iVar6,(char *)local_148._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_f0,(Message *)&local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._0_8_ != &local_138) goto LAB_001207c3;
              goto LAB_001207c8;
            }
            Key_abi_cxx11_(&local_128,(leveldb *)(uVar18 & 0xffffffff),iVar6);
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_128._M_dataplus._M_p;
            puStack_a0 = (undefined8 *)local_128._M_string_length;
            Key_abi_cxx11_(&local_f0,(leveldb *)(uVar18 + 10 & 0xffffffff),i_00);
            local_148._0_8_ = local_a8;
            local_148._8_8_ = puStack_a0;
            local_138._M_allocated_capacity = (size_type)local_f0._M_dataplus._M_p;
            local_138._8_8_ = local_f0._M_string_length;
            pDVar2 = (this->super_DBTest).db_;
            (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_d0);
            lVar13 = CONCAT71(uStack_cf,local_d0);
            uVar8 = lVar13 - 1000000;
            if (50000 < uVar8) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",lVar13,1000000,0x100590);
              lVar13 = extraout_RDX_09;
            }
            local_100.data_ = (char *)CONCAT71(local_100.data_._1_7_,uVar8 < 0xc351);
            local_100.size_ = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
              lVar13 = extraout_RDX_05;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
              lVar13 = extraout_RDX_06;
            }
            if (50000 < uVar8) {
              testing::Message::Message((Message *)&local_128);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_148,(internal *)&local_100,
                         (AssertionResult *)"Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10)",
                         "false","true",in_R9);
              iVar6 = 0x4c0;
              goto LAB_0012079e;
            }
            plVar16 = plVar16 + 0x200b2;
            plVar15 = plVar15 + 0x1e848;
            bVar20 = uVar18 < 0x46;
            uVar18 = uVar18 + 10;
          } while (bVar20);
          Key_abi_cxx11_(&local_128,(leveldb *)0x32,(int)lVar13);
          local_148._0_8_ = "";
          local_148._8_8_ = (undefined8 *)0x0;
          local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
          local_138._8_8_ = local_128._M_string_length;
          pDVar2 = (this->super_DBTest).db_;
          (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_100);
          plVar15 = (long *)((long)local_100.data_ + -5000000);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100.data_;
          if ((long *)0x3d090 < plVar15) {
            fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100.data_,5000000,
                    0x501bd0);
            paVar12 = extraout_RDX_13;
          }
          uVar8 = local_b8;
          iVar6 = (int)paVar12;
          local_f0._M_dataplus._M_p._0_1_ = plVar15 < (long *)0x3d091;
          local_f0._M_string_length = 0;
          paVar12 = &local_128.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar12) {
            operator_delete(local_128._M_dataplus._M_p);
            iVar6 = extraout_EDX_02;
          }
          if ((long *)0x3d090 < plVar15) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_148,(internal *)&local_f0,
                       (AssertionResult *)"Between(Size(\"\", Key(50)), S1 * 50, S2 * 50)","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x4c2,(char *)local_148._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_100,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._0_8_ != &local_138) goto LAB_001206e1;
            goto LAB_001206e6;
          }
          Key_abi_cxx11_(&local_f0,(leveldb *)0x32,iVar6);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          puVar1 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_128.field_2._M_allocated_capacity = *puVar1;
            local_128.field_2._8_4_ = *(undefined4 *)(puVar10 + 3);
            local_128.field_2._12_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
            local_128._M_dataplus._M_p = (pointer)paVar12;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar1;
            local_128._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_138._8_8_ = puVar10[1];
          *puVar10 = puVar1;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          local_148._0_8_ = "";
          local_148._8_8_ = (undefined8 *)0x0;
          local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
          pDVar2 = (this->super_DBTest).db_;
          local_128._M_string_length = local_138._8_8_;
          (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_d0);
          lVar13 = CONCAT71(uStack_cf,local_d0);
          uVar18 = lVar13 - 5000000;
          if (250000 < uVar18) {
            fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",lVar13,5000000,0x501bd0);
            lVar13 = extraout_RDX_14;
          }
          iVar6 = (int)lVar13;
          local_100.data_ = (char *)CONCAT71(local_100.data_._1_7_,uVar18 < 0x3d091);
          local_100.size_ = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar12) {
            operator_delete(local_128._M_dataplus._M_p);
            iVar6 = extraout_EDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
            iVar6 = extraout_EDX_04;
          }
          if (250000 < uVar18) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_148,(internal *)&local_100,
                       (AssertionResult *)
                       "Between(Size(\"\", Key(50) + \".suffix\"), S1 * 50, S2 * 50)","false","true"
                       ,in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x4c3,(char *)local_148._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f0,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._0_8_ != &local_138) {
LAB_001207c3:
              operator_delete((void *)local_148._0_8_);
            }
LAB_001207c8:
            puVar10 = (undefined8 *)local_100.size_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
              puVar10 = (undefined8 *)local_100.size_;
            }
            goto LAB_001207dd;
          }
          uVar14 = (uint)uVar8;
          Key_abi_cxx11_((string *)local_148,(leveldb *)(uVar8 & 0xffffffff),iVar6);
          Key_abi_cxx11_(&local_128,(leveldb *)(ulong)(uVar14 + 9),i_01);
          local_f0._M_dataplus._M_p = (pointer)local_148._0_8_;
          local_f0._M_string_length = local_148._8_8_;
          local_100.data_ = local_128._M_dataplus._M_p;
          local_100.size_ = local_128._M_string_length;
          DBImpl::TEST_CompactRange
                    ((DBImpl *)(this->super_DBTest).db_,0,(Slice *)&local_f0,&local_100);
          lVar13 = extraout_RDX_10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar12) {
            operator_delete(local_128._M_dataplus._M_p);
            lVar13 = extraout_RDX_11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._0_8_ != &local_138) {
            operator_delete((void *)local_148._0_8_);
            lVar13 = extraout_RDX_12;
          }
          uVar8 = (ulong)(uVar14 + 10);
        } while (uVar14 < 0x46);
        iVar6 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
        local_128._M_dataplus._M_p._0_4_ = iVar6;
        local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_148,"NumTableFilesAtLevel(0)","0",(int *)&local_128,
                   (int *)&local_f0);
        iVar6 = local_c0;
        uVar3 = local_148._8_8_;
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)local_148._8_8_ == (undefined8 *)0x0) {
            pcVar17 = "";
          }
          else {
            pcVar17 = *(char **)local_148._8_8_;
          }
          iVar6 = 0x4cc;
          goto LAB_00120844;
        }
        if ((undefined8 *)local_148._8_8_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_148._8_8_ != (undefined8 *)(local_148._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_148._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        iVar7 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
        local_128._M_dataplus._M_p._0_4_ = iVar7;
        local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperGT<int,int>
                  ((internal *)local_148,"NumTableFilesAtLevel(1)","0",(int *)&local_128,
                   (int *)&local_f0);
        uVar3 = local_148._8_8_;
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)local_148._8_8_ == (undefined8 *)0x0) {
            pcVar17 = "";
          }
          else {
            pcVar17 = *(char **)local_148._8_8_;
          }
          iVar6 = 0x4cd;
          goto LAB_00120844;
        }
        if ((undefined8 *)local_148._8_8_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_148._8_8_ != (undefined8 *)(local_148._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_148._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != 3);
    }
    else {
      DBTest::Reopen(&this->super_DBTest,&local_90);
      Key_abi_cxx11_(&local_128,(leveldb *)0x32,i);
      local_148._0_8_ = "";
      local_148._8_8_ = (undefined8 *)0x0;
      local_138._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
      local_138._8_8_ = local_128._M_string_length;
      pDVar2 = (this->super_DBTest).db_;
      (*pDVar2->_vptr_DB[10])(pDVar2,local_148,1,&local_f0);
      _Var4._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_f0._M_dataplus._M_p,0,0);
      }
      local_f0._M_dataplus._M_p._0_1_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var4._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_f0._M_string_length = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p == paVar12) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_001204ba;
        bVar20 = true;
      }
      else {
        operator_delete(local_128._M_dataplus._M_p);
        bVar20 = true;
        if (((ulong)local_f0._M_dataplus._M_p & 1) == 0) {
LAB_001204ba:
          testing::Message::Message((Message *)&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_148,(internal *)&local_f0,
                     (AssertionResult *)"Between(Size(\"\", Key(50)), 0, 0)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x4b3,(char *)local_148._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_100,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._0_8_ != &local_138) {
            operator_delete((void *)local_148._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
          }
          bVar20 = false;
        }
      }
      sVar5 = local_f0._M_string_length;
      if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_f0._M_string_length !=
            (undefined8 *)(local_f0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_f0._M_string_length);
        }
        operator_delete((void *)sVar5);
      }
      if (!bVar20) {
        return;
      }
    }
    iVar6 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar6 + 1;
    if (2 < iVar6) {
      return;
    }
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  } while( true );
}

Assistant:

TEST_F(DBTest, ApproximateSizes) {
  do {
    Options options = CurrentOptions();
    options.write_buffer_size = 100000000;  // Large write buffer
    options.compression = kNoCompression;
    DestroyAndReopen();

    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));
    Reopen(&options);
    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));

    // Write 8MB (80 values, each 100K)
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
    const int N = 80;
    static const int S1 = 100000;
    static const int S2 = 105000;  // Allow some expansion from metadata
    Random rnd(301);
    for (int i = 0; i < N; i++) {
      ASSERT_LEVELDB_OK(Put(Key(i), RandomString(&rnd, S1)));
    }

    // 0 because GetApproximateSizes() does not account for memtable space
    ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));

    if (options.reuse_logs) {
      // Recovery will reuse memtable, and GetApproximateSizes() does not
      // account for memtable usage;
      Reopen(&options);
      ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));
      continue;
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      for (int compact_start = 0; compact_start < N; compact_start += 10) {
        for (int i = 0; i < N; i += 10) {
          ASSERT_TRUE(Between(Size("", Key(i)), S1 * i, S2 * i));
          ASSERT_TRUE(Between(Size("", Key(i) + ".suffix"), S1 * (i + 1),
                              S2 * (i + 1)));
          ASSERT_TRUE(Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10));
        }
        ASSERT_TRUE(Between(Size("", Key(50)), S1 * 50, S2 * 50));
        ASSERT_TRUE(Between(Size("", Key(50) + ".suffix"), S1 * 50, S2 * 50));

        std::string cstart_str = Key(compact_start);
        std::string cend_str = Key(compact_start + 9);
        Slice cstart = cstart_str;
        Slice cend = cend_str;
        dbfull()->TEST_CompactRange(0, &cstart, &cend);
      }

      ASSERT_EQ(NumTableFilesAtLevel(0), 0);
      ASSERT_GT(NumTableFilesAtLevel(1), 0);
    }
  } while (ChangeOptions());
}